

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O3

void __thiscall
pstore::region::file_based_factory::add
          (file_based_factory *this,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t original_size,uint64_t new_size)

{
  shared_ptr<pstore::file::file_handle> local_18;
  
  local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->file_).super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (this->file_).super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  factory::append<pstore::file::file_handle,pstore::memory_mapper>
            (&this->super_factory,&local_18,regions,original_size,new_size);
  if (local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void file_based_factory::add (gsl::not_null<std::vector<memory_mapper_ptr> *> const regions,
                                      std::uint64_t const original_size,
                                      std::uint64_t const new_size) {
            this->append<file::file_handle, memory_mapper> (file_, regions, original_size,
                                                            new_size);
        }